

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_option_message.hpp
# Opt level: O3

void iutest::detail::iuOptionMessage::ShowSpec(void)

{
  iuConsole::output("#define %s  %s\n","IUTEST_PLATFORM","\"LINUX\"");
  iuConsole::output("#define %s  %s\n","IUTEST_CHECK_STRICT","1");
  iuConsole::output("#define %s  %s\n","IUTEST_CPLUSPLUS","201703L");
  iuConsole::output("#define %s  %s\n","IUTEST_FORCE_COLORCONSOLE","0");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_ANALYSIS_ASSUME","0");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_ATTRIBUTE","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_ATTRIBUTE_DEPRECATED","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_ATTRIBUTE_LIKELY_UNLIKELY","0");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_AUTO","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CATCH_SEH_EXCEPTION_ASSERTION","0");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CHAR16_T","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CHAR16_T_PRINTABLE","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CHAR32_T","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CHAR32_T_PRINTABLE","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CLOCK","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_COLORCONSOLE","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CONCEPTS","0");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CONSTEXPR","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CONSTEXPR_IF","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_COUNTER_MACRO","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CTIME","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CXX_HDR_ANY","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CXX_HDR_ARRAY","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CXX_HDR_CHARCONV","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CXX_HDR_CHRONO","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CXX_HDR_CODECVT","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CXX_HDR_CSTDINT","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CXX_HDR_CUCHAR","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CXX_HDR_FILESYSTEM","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CXX_HDR_OPTIONAL","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CXX_HDR_RANDOM","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CXX_HDR_REGEX","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CXX_HDR_STRING_VIEW","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CXX_HDR_TYPE_TARITS","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CXX_HDR_VARIANT","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CXX_HDR_VERSION","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CXX11","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CXX14","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CXX1Z","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CXX17","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CXX2A","0");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CXX20","0");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_CXX2B","0");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_DECLTYPE","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_DEFAULT_FUNCTIONS","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_DELETED_FUNCTIONS","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_EXCEPTIONS","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_EXPLICIT_CONVERSION","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_EXTERN_TEMPLATE","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_FD_DUP","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_FILENO","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_FILE_STAT","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_FLOAT128","0");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_FOPEN","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_GETTIMEOFDAY","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_HDR_CXXABI","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_HDR_SYSTIME","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_IF_EXISTS","0");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_INITIALIZER_LIST","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_INLINE_VARIABLE","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_INT128","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_IOMANIP","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_LAMBDA","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_LAMBDA_STATEMENTS","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_LARGEFILE_API","0");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_LONG_DOUBLE","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_MKSTEMP","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_MOVE_ASSIGNMENT_DEFAULT_FUNCTION","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_NOEXCEPT","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_NULLPTR","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_OVERRIDE_AND_FINAL","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_RTTI","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_RVALUE_REFS","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_SEH","0");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_STD_BEGIN_END","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_STD_DECLVAL","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_STD_EMPLACE","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_STD_FILESYSTEM","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_STD_QUICK_EXIT","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_STD_STR_TO_VALUE","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_STD_TO_CHARS","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_STRINGSTREAM","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_STRONG_ENUMS","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_STRSTREAM","0");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_TUPLE","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_VARIADIC_TEMPLATES","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_VARIADIC_TEMPLATE_TEMPLATES","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_VARIADIC_TUPLES","1");
  iuConsole::output("#define %s  %s\n","IUTEST_HAS_WANT_SECURE_LIB","0");
  iuConsole::output("#define %s  %s\n","IUTEST_LONG_DOUBLE_AS_IS_DOUBLE","0");
  iuConsole::output("#define %s  %s\n","IUTEST_UNICODE","0");
  iuConsole::output("#define %s  %s\n","IUTEST_USE_OWN_LIST","0");
  iuConsole::output("#define %s  %s\n","IUTEST_USE_OWN_STRING_VIEW","0");
  iuConsole::output("#define %s  %s\n","IUTEST_USE_THROW_ON_ASSERTION_FAILURE","0");
  iuConsole::output("#define %s  %s\n","IUTEST_WCHAR_UNSIGNED","0");
  iuConsole::output("#define %s  %s\n","IUTEST_LIBSTDCXX_VERSION","60100");
  iuConsole::output("#define %s  %s\n","__GLIBCXX__","20230528");
  iuConsole::output("#define %s  %s\n","_GLIBCXX_USE_CXX11_ABI","1");
  return;
}

Assistant:

inline void iuOptionMessage::ShowSpec()
{
    IIUT_SHOW_MACRO(IUTEST_PLATFORM);

    IIUT_SHOW_MACRO(IUTEST_CHECK_STRICT);
    IIUT_SHOW_MACRO(IUTEST_CPLUSPLUS);
    IIUT_SHOW_MACRO(IUTEST_FORCE_COLORCONSOLE);
    IIUT_SHOW_MACRO(IUTEST_HAS_ANALYSIS_ASSUME);
    IIUT_SHOW_MACRO(IUTEST_HAS_ATTRIBUTE);
    IIUT_SHOW_MACRO(IUTEST_HAS_ATTRIBUTE_DEPRECATED);
    IIUT_SHOW_MACRO(IUTEST_HAS_ATTRIBUTE_LIKELY_UNLIKELY);
    IIUT_SHOW_MACRO(IUTEST_HAS_AUTO);
    IIUT_SHOW_MACRO(IUTEST_HAS_CATCH_SEH_EXCEPTION_ASSERTION);
    IIUT_SHOW_MACRO(IUTEST_HAS_CHAR16_T);
    IIUT_SHOW_MACRO(IUTEST_HAS_CHAR16_T_PRINTABLE);
    IIUT_SHOW_MACRO(IUTEST_HAS_CHAR32_T);
    IIUT_SHOW_MACRO(IUTEST_HAS_CHAR32_T_PRINTABLE);
    IIUT_SHOW_MACRO(IUTEST_HAS_CLOCK);
    IIUT_SHOW_MACRO(IUTEST_HAS_COLORCONSOLE);
    IIUT_SHOW_MACRO(IUTEST_HAS_CONCEPTS);
    IIUT_SHOW_MACRO(IUTEST_HAS_CONSTEXPR);
    IIUT_SHOW_MACRO(IUTEST_HAS_CONSTEXPR_IF);
    IIUT_SHOW_MACRO(IUTEST_HAS_COUNTER_MACRO);
    IIUT_SHOW_MACRO(IUTEST_HAS_CTIME);
    IIUT_SHOW_MACRO(IUTEST_HAS_CXX_HDR_ANY);
    IIUT_SHOW_MACRO(IUTEST_HAS_CXX_HDR_ARRAY);
    IIUT_SHOW_MACRO(IUTEST_HAS_CXX_HDR_CHARCONV);
    IIUT_SHOW_MACRO(IUTEST_HAS_CXX_HDR_CHRONO);
    IIUT_SHOW_MACRO(IUTEST_HAS_CXX_HDR_CODECVT);
    IIUT_SHOW_MACRO(IUTEST_HAS_CXX_HDR_CSTDINT);
    IIUT_SHOW_MACRO(IUTEST_HAS_CXX_HDR_CUCHAR);
    IIUT_SHOW_MACRO(IUTEST_HAS_CXX_HDR_FILESYSTEM);
    IIUT_SHOW_MACRO(IUTEST_HAS_CXX_HDR_OPTIONAL);
    IIUT_SHOW_MACRO(IUTEST_HAS_CXX_HDR_RANDOM);
    IIUT_SHOW_MACRO(IUTEST_HAS_CXX_HDR_REGEX);
    IIUT_SHOW_MACRO(IUTEST_HAS_CXX_HDR_STRING_VIEW);
    IIUT_SHOW_MACRO(IUTEST_HAS_CXX_HDR_TYPE_TARITS);
    IIUT_SHOW_MACRO(IUTEST_HAS_CXX_HDR_VARIANT);
    IIUT_SHOW_MACRO(IUTEST_HAS_CXX_HDR_VERSION);
    IIUT_SHOW_MACRO(IUTEST_HAS_CXX11);
    IIUT_SHOW_MACRO(IUTEST_HAS_CXX14);
    IIUT_SHOW_MACRO(IUTEST_HAS_CXX1Z);
    IIUT_SHOW_MACRO(IUTEST_HAS_CXX17);
    IIUT_SHOW_MACRO(IUTEST_HAS_CXX2A);
    IIUT_SHOW_MACRO(IUTEST_HAS_CXX20);
    IIUT_SHOW_MACRO(IUTEST_HAS_CXX2B);
    IIUT_SHOW_MACRO(IUTEST_HAS_DECLTYPE);
    IIUT_SHOW_MACRO(IUTEST_HAS_DEFAULT_FUNCTIONS);
    IIUT_SHOW_MACRO(IUTEST_HAS_DELETED_FUNCTIONS);
    IIUT_SHOW_MACRO(IUTEST_HAS_EXCEPTIONS);
    IIUT_SHOW_MACRO(IUTEST_HAS_EXPLICIT_CONVERSION);
    IIUT_SHOW_MACRO(IUTEST_HAS_EXTERN_TEMPLATE);
    IIUT_SHOW_MACRO(IUTEST_HAS_FD_DUP);
    IIUT_SHOW_MACRO(IUTEST_HAS_FILENO);
    IIUT_SHOW_MACRO(IUTEST_HAS_FILE_STAT);
    IIUT_SHOW_MACRO(IUTEST_HAS_FLOAT128);
    IIUT_SHOW_MACRO(IUTEST_HAS_FOPEN);
    IIUT_SHOW_MACRO(IUTEST_HAS_GETTIMEOFDAY);
    IIUT_SHOW_MACRO(IUTEST_HAS_HDR_CXXABI);
    IIUT_SHOW_MACRO(IUTEST_HAS_HDR_SYSTIME);
    IIUT_SHOW_MACRO(IUTEST_HAS_IF_EXISTS);
    IIUT_SHOW_MACRO(IUTEST_HAS_INITIALIZER_LIST);
    IIUT_SHOW_MACRO(IUTEST_HAS_INLINE_VARIABLE);
    IIUT_SHOW_MACRO(IUTEST_HAS_INT128);
    IIUT_SHOW_MACRO(IUTEST_HAS_IOMANIP);
    IIUT_SHOW_MACRO(IUTEST_HAS_LAMBDA);
    IIUT_SHOW_MACRO(IUTEST_HAS_LAMBDA_STATEMENTS);
    IIUT_SHOW_MACRO(IUTEST_HAS_LARGEFILE_API);
    IIUT_SHOW_MACRO(IUTEST_HAS_LONG_DOUBLE);
    IIUT_SHOW_MACRO(IUTEST_HAS_MKSTEMP);
    IIUT_SHOW_MACRO(IUTEST_HAS_MOVE_ASSIGNMENT_DEFAULT_FUNCTION);
    IIUT_SHOW_MACRO(IUTEST_HAS_NOEXCEPT);
    IIUT_SHOW_MACRO(IUTEST_HAS_NULLPTR);
    IIUT_SHOW_MACRO(IUTEST_HAS_OVERRIDE_AND_FINAL);
    IIUT_SHOW_MACRO(IUTEST_HAS_RTTI);
    IIUT_SHOW_MACRO(IUTEST_HAS_RVALUE_REFS);
    IIUT_SHOW_MACRO(IUTEST_HAS_SEH);
    IIUT_SHOW_MACRO(IUTEST_HAS_STD_BEGIN_END);
    IIUT_SHOW_MACRO(IUTEST_HAS_STD_DECLVAL);
    IIUT_SHOW_MACRO(IUTEST_HAS_STD_EMPLACE);
    IIUT_SHOW_MACRO(IUTEST_HAS_STD_FILESYSTEM);
    IIUT_SHOW_MACRO(IUTEST_HAS_STD_QUICK_EXIT);
    IIUT_SHOW_MACRO(IUTEST_HAS_STD_STR_TO_VALUE);
    IIUT_SHOW_MACRO(IUTEST_HAS_STD_TO_CHARS);
    IIUT_SHOW_MACRO(IUTEST_HAS_STRINGSTREAM);
    IIUT_SHOW_MACRO(IUTEST_HAS_STRONG_ENUMS);
    IIUT_SHOW_MACRO(IUTEST_HAS_STRSTREAM);
    IIUT_SHOW_MACRO(IUTEST_HAS_TUPLE);
    IIUT_SHOW_MACRO(IUTEST_HAS_VARIADIC_TEMPLATES);
    IIUT_SHOW_MACRO(IUTEST_HAS_VARIADIC_TEMPLATE_TEMPLATES);
    IIUT_SHOW_MACRO(IUTEST_HAS_VARIADIC_TUPLES);
    IIUT_SHOW_MACRO(IUTEST_HAS_WANT_SECURE_LIB);
    IIUT_SHOW_MACRO(IUTEST_LONG_DOUBLE_AS_IS_DOUBLE);
    IIUT_SHOW_MACRO(IUTEST_UNICODE);
    IIUT_SHOW_MACRO(IUTEST_USE_OWN_LIST);
    IIUT_SHOW_MACRO(IUTEST_USE_OWN_STRING_VIEW);
    IIUT_SHOW_MACRO(IUTEST_USE_THROW_ON_ASSERTION_FAILURE);
    IIUT_SHOW_MACRO(IUTEST_WCHAR_UNSIGNED);

#ifdef IUTEST_LIBSTDCXX_VERSION
    IIUT_SHOW_MACRO(IUTEST_LIBSTDCXX_VERSION);
#endif

#ifdef _MSC_FULL_VER
    IIUT_SHOW_MACRO(_MSC_FULL_VER);
#endif
#ifdef _MSVC_LANG
    IIUT_SHOW_MACRO(_MSVC_LANG);
#endif
#ifdef __GLIBCXX__
    IIUT_SHOW_MACRO(__GLIBCXX__);
#endif
#ifdef __GLIBCPP__
    IIUT_SHOW_MACRO(__GLIBCPP__);
#endif
#ifdef _GLIBCXX_USE_CXX11_ABI
    IIUT_SHOW_MACRO(_GLIBCXX_USE_CXX11_ABI);
#endif
#ifdef _LIBCPP_VERSION
    IIUT_SHOW_MACRO(_LIBCPP_VERSION);
#endif
#ifdef __POSIX_VISIBLE
    IIUT_SHOW_MACRO(__POSIX_VISIBLE);
#endif
#ifdef __USE_MINGW_ANSI_STDIO
    IIUT_SHOW_MACRO(__USE_MINGW_ANSI_STDIO);
#endif
#ifdef __MAC_OS_X_VERSION_MIN_REQUIRED
    IIUT_SHOW_MACRO(__MAC_OS_X_VERSION_MIN_REQUIRED);
#endif

#undef IIUT_SHOW_MACRO
}